

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolor.cpp
# Opt level: O3

QString * __thiscall QColor::name(QString *__return_storage_ptr__,QColor *this,NameFormat format)

{
  QRgb QVar1;
  long in_FS_OFFSET;
  bool bVar2;
  QArrayData *local_48;
  long local_40;
  ulong local_38;
  QStringBuilder<char16_t,_QStringView> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (format == HexArgb) {
    QVar1 = rgba(this);
    QString::number((longlong)&local_48,QVar1);
    bVar2 = local_38 < 8;
    local_30.b.m_size = 8;
  }
  else {
    if (format != HexRgb) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
        return __return_storage_ptr__;
      }
      goto LAB_0035b95f;
    }
    QVar1 = rgba(this);
    QString::number((uint)&local_48,QVar1 | 0x1000000);
    bVar2 = local_38 < 6;
    local_30.b.m_size = 6;
  }
  if (bVar2) {
    local_30.b.m_size = local_38;
  }
  local_30.b.m_data =
       (storage_type_conflict *)
       ((local_38 * 2 + local_40) - (ulong)(uint)((int)local_30.b.m_size * 2));
  local_30.a = L'#';
  QStringBuilder<char16_t,_QStringView>::convertTo<QString>(__return_storage_ptr__,&local_30);
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
LAB_0035b95f:
  __stack_chk_fail();
}

Assistant:

QString QColor::name(NameFormat format) const
{
    switch (format) {
    case HexRgb:
        return u'#' + QStringView{QString::number(rgba() | 0x1000000, 16)}.right(6);
    case HexArgb:
        // it's called rgba() but it does return AARRGGBB
        return u'#' + QStringView{QString::number(rgba() | Q_INT64_C(0x100000000), 16)}.right(8);
    }
    return QString();
}